

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-def.cpp
# Opt level: O1

void __thiscall JitFFI::JitFuncCallerCreaterX64::push(JitFuncCallerCreaterX64 *this,uint64_t dat)

{
  JitFuncCreater *this_00;
  size_t in_RCX;
  uint64_t local_20;
  
  this_00 = this->data;
  JitFuncCreater::push(this_00,'H');
  JitFuncCreater::push(this_00,0xb8);
  local_20 = dat;
  JitFuncCreater::write(this_00,(int)&local_20,(void *)0x8,in_RCX);
  JitFuncCreater::push(this->data,'P');
  this->push_count = this->push_count + 1;
  return;
}

Assistant:

void JitFuncCallerCreaterX64::push(uint64_t dat) {
		OpCode_x64::movq_u64(data, OpCode_x64::rax, dat);
		OpCode_x64::push(data, OpCode_x64::rax);
		push_count += 1;
	}